

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make.cc
# Opt level: O3

void __thiscall GNUmakeTokenPool::~GNUmakeTokenPool(GNUmakeTokenPool *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool GNUmakeTokenPool::Setup(bool ignore,
                             bool verbose,
                             double& max_load_average) {
  const char* value = GetEnv("MAKEFLAGS");
  if (!value)
    return false;

  // GNU make <= 4.1
  const char* jobserver = strstr(value, "--jobserver-fds=");
  if (!jobserver)
    // GNU make => 4.2
    jobserver = strstr(value, "--jobserver-auth=");
  if (jobserver) {
    LinePrinter printer;

    if (ignore) {
      printer.PrintOnNewLine("ninja: warning: -jN forced on command line; ignoring GNU make jobserver.\n");
    } else {
      if (ParseAuth(jobserver)) {
        const char* l_arg = strstr(value, " -l");
        int load_limit = -1;

        if (verbose) {
          printer.PrintOnNewLine("ninja: using GNU make jobserver.\n");
        }

        // translate GNU make -lN to ninja -lN
        if (l_arg &&
            (sscanf(l_arg + 3, "%d ", &load_limit) == 1) &&
            (load_limit > 0)) {
          max_load_average = load_limit;
        }

        return true;
      }
    }
  }

  return false;
}